

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O2

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint32_t l [16];
  uint32_t local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  
  uVar8 = (ulong)a->d[0];
  uVar15 = (ulong)b->d[0];
  local_78 = (uint32_t)(uVar15 * uVar8);
  uVar10 = (ulong)b->d[1];
  uVar1 = uVar10 * uVar8 + (uVar15 * uVar8 >> 0x20);
  uVar9 = (uint)(uVar1 >> 0x20);
  uVar6 = (ulong)a->d[1];
  lVar2 = uVar6 * uVar15 + (uVar1 & 0xffffffff);
  local_74 = (undefined4)lVar2;
  uVar21 = (uint)((ulong)lVar2 >> 0x20);
  uVar7 = (ulong)b->d[2];
  uVar1 = uVar7 * uVar8 + (ulong)(uVar9 + uVar21);
  uVar23 = (uint)(uVar1 >> 0x20);
  uVar9 = (uint)CARRY4(uVar21,uVar9);
  uVar24 = uVar23 + uVar9;
  uVar1 = uVar6 * uVar10 + (uVar1 & 0xffffffff);
  uVar21 = (uint)(uVar1 >> 0x20);
  uVar13 = uVar21 + uVar24;
  uVar28 = (ulong)a->d[2];
  lVar2 = uVar28 * uVar15 + (uVar1 & 0xffffffff);
  local_70 = (undefined4)lVar2;
  uVar25 = (uint)((ulong)lVar2 >> 0x20);
  uVar21 = (uint)CARRY4(uVar21,uVar24) + (uint)CARRY4(uVar23,uVar9) + (uint)CARRY4(uVar25,uVar13);
  uVar19 = (ulong)b->d[3];
  uVar1 = uVar19 * uVar8 + (ulong)(uVar25 + uVar13);
  uVar24 = (uint)(uVar1 >> 0x20);
  uVar1 = uVar7 * uVar6 + (uVar1 & 0xffffffff);
  uVar13 = (uint)(uVar1 >> 0x20);
  uVar9 = uVar21 + uVar24;
  uVar23 = uVar13 + uVar9;
  uVar1 = uVar28 * uVar10 + (uVar1 & 0xffffffff);
  uVar25 = (uint)(uVar1 >> 0x20);
  uVar29 = uVar25 + uVar23;
  uVar22 = (ulong)a->d[3];
  lVar2 = uVar22 * uVar15 + (uVar1 & 0xffffffff);
  local_6c = (undefined4)lVar2;
  uVar30 = (uint)((ulong)lVar2 >> 0x20);
  uVar9 = (uint)CARRY4(uVar25,uVar23) + (uint)CARRY4(uVar13,uVar9) + (uint)CARRY4(uVar24,uVar21) +
          (uint)CARRY4(uVar30,uVar29);
  uVar16 = (ulong)b->d[4];
  uVar1 = uVar16 * uVar8 + (ulong)(uVar30 + uVar29);
  uVar21 = (uint)(uVar1 >> 0x20);
  uVar13 = uVar21 + uVar9;
  uVar1 = uVar19 * uVar6 + (uVar1 & 0xffffffff);
  uVar29 = (uint)(uVar1 >> 0x20);
  uVar30 = uVar29 + uVar13;
  uVar1 = uVar28 * uVar7 + (uVar1 & 0xffffffff);
  uVar23 = (uint)(uVar1 >> 0x20);
  uVar24 = uVar23 + uVar30;
  uVar1 = uVar22 * uVar10 + (uVar1 & 0xffffffff);
  uVar31 = (uint)(uVar1 >> 0x20);
  uVar32 = uVar31 + uVar24;
  uVar14 = (ulong)a->d[4];
  lVar2 = uVar14 * uVar15 + (uVar1 & 0xffffffff);
  local_68 = (undefined4)lVar2;
  uVar25 = (uint)((ulong)lVar2 >> 0x20);
  uVar24 = (uint)CARRY4(uVar31,uVar24) +
           (uint)CARRY4(uVar29,uVar13) + (uint)CARRY4(uVar21,uVar9) + (uint)CARRY4(uVar23,uVar30) +
           (uint)CARRY4(uVar25,uVar32);
  uVar11 = (ulong)b->d[5];
  uVar1 = uVar11 * uVar8 + (ulong)(uVar25 + uVar32);
  uVar23 = (uint)(uVar1 >> 0x20);
  uVar1 = uVar16 * uVar6 + (uVar1 & 0xffffffff);
  uVar33 = (uint)(uVar1 >> 0x20);
  uVar9 = uVar24 + uVar23;
  uVar34 = uVar33 + uVar9;
  uVar1 = uVar19 * uVar28 + (uVar1 & 0xffffffff);
  uVar29 = (uint)(uVar1 >> 0x20);
  uVar30 = uVar29 + uVar34;
  uVar1 = uVar22 * uVar7 + (uVar1 & 0xffffffff);
  uVar21 = (uint)(uVar1 >> 0x20);
  uVar13 = uVar21 + uVar30;
  uVar1 = uVar14 * uVar10 + (uVar1 & 0xffffffff);
  uVar31 = (uint)(uVar1 >> 0x20);
  uVar32 = uVar31 + uVar13;
  uVar20 = (ulong)a->d[5];
  lVar2 = uVar20 * uVar15 + (uVar1 & 0xffffffff);
  local_64 = (undefined4)lVar2;
  uVar25 = (uint)((ulong)lVar2 >> 0x20);
  uVar24 = (uint)CARRY4(uVar31,uVar13) +
           (uint)CARRY4(uVar29,uVar34) + (uint)CARRY4(uVar33,uVar9) + (uint)CARRY4(uVar23,uVar24) +
           (uint)CARRY4(uVar21,uVar30) + (uint)CARRY4(uVar25,uVar32);
  uVar12 = (ulong)b->d[6];
  uVar1 = uVar12 * uVar8 + (ulong)(uVar25 + uVar32);
  uVar9 = (uint)(uVar1 >> 0x20);
  uVar21 = uVar9 + uVar24;
  uVar1 = uVar11 * uVar6 + (uVar1 & 0xffffffff);
  uVar25 = (uint)(uVar1 >> 0x20);
  uVar29 = uVar25 + uVar21;
  uVar1 = uVar16 * uVar28 + (uVar1 & 0xffffffff);
  uVar13 = (uint)(uVar1 >> 0x20);
  uVar23 = uVar13 + uVar29;
  uVar1 = uVar22 * uVar19 + (uVar1 & 0xffffffff);
  uVar35 = (uint)(uVar1 >> 0x20);
  uVar36 = uVar35 + uVar23;
  uVar1 = uVar14 * uVar7 + (uVar1 & 0xffffffff);
  uVar32 = (uint)(uVar1 >> 0x20);
  uVar33 = uVar32 + uVar36;
  uVar1 = uVar20 * uVar10 + (uVar1 & 0xffffffff);
  uVar30 = (uint)(uVar1 >> 0x20);
  uVar31 = uVar30 + uVar33;
  uVar17 = (ulong)a->d[6];
  lVar2 = uVar17 * uVar15 + (uVar1 & 0xffffffff);
  local_60 = (undefined4)lVar2;
  uVar34 = (uint)((ulong)lVar2 >> 0x20);
  uVar21 = (uint)CARRY4(uVar30,uVar33) +
           (uint)CARRY4(uVar35,uVar23) +
           (uint)CARRY4(uVar25,uVar21) + (uint)CARRY4(uVar9,uVar24) + (uint)CARRY4(uVar13,uVar29) +
           (uint)CARRY4(uVar32,uVar36) + (uint)CARRY4(uVar34,uVar31);
  uVar18 = (ulong)b->d[7];
  uVar1 = uVar8 * uVar18 + (ulong)(uVar34 + uVar31);
  uVar13 = (uint)(uVar1 >> 0x20);
  uVar1 = uVar12 * uVar6 + (uVar1 & 0xffffffff);
  uVar32 = (uint)(uVar1 >> 0x20);
  uVar9 = uVar21 + uVar13;
  uVar33 = uVar32 + uVar9;
  uVar1 = uVar11 * uVar28 + (uVar1 & 0xffffffff);
  uVar23 = (uint)(uVar1 >> 0x20);
  uVar24 = uVar23 + uVar33;
  uVar1 = uVar16 * uVar22 + (uVar1 & 0xffffffff);
  uVar35 = (uint)(uVar1 >> 0x20);
  uVar36 = uVar35 + uVar24;
  uVar1 = uVar14 * uVar19 + (uVar1 & 0xffffffff);
  uVar25 = (uint)(uVar1 >> 0x20);
  uVar29 = uVar25 + uVar36;
  uVar1 = uVar20 * uVar7 + (uVar1 & 0xffffffff);
  uVar26 = (uint)(uVar1 >> 0x20);
  uVar27 = uVar26 + uVar29;
  uVar1 = uVar17 * uVar10 + (uVar1 & 0xffffffff);
  uVar30 = (uint)(uVar1 >> 0x20);
  uVar31 = uVar30 + uVar27;
  uVar8 = (ulong)a->d[7];
  lVar2 = uVar15 * uVar8 + (uVar1 & 0xffffffff);
  uVar34 = (uint)((ulong)lVar2 >> 0x20);
  uVar9 = (uint)CARRY4(uVar30,uVar27) +
          (uint)CARRY4(uVar25,uVar36) +
          (uint)CARRY4(uVar23,uVar33) + (uint)CARRY4(uVar32,uVar9) + (uint)CARRY4(uVar13,uVar21) +
          (uint)CARRY4(uVar35,uVar24) + (uint)CARRY4(uVar26,uVar29) + (uint)CARRY4(uVar34,uVar31);
  uVar1 = uVar6 * uVar18 + (ulong)(uVar34 + uVar31);
  uVar30 = (uint)(uVar1 >> 0x20);
  uVar31 = uVar30 + uVar9;
  uVar1 = uVar12 * uVar28 + (uVar1 & 0xffffffff);
  uVar21 = (uint)(uVar1 >> 0x20);
  uVar13 = uVar21 + uVar31;
  uVar1 = uVar11 * uVar22 + (uVar1 & 0xffffffff);
  uVar33 = (uint)(uVar1 >> 0x20);
  uVar34 = uVar33 + uVar13;
  uVar1 = uVar14 * uVar16 + (uVar1 & 0xffffffff);
  uVar23 = (uint)(uVar1 >> 0x20);
  uVar24 = uVar23 + uVar34;
  uVar1 = uVar20 * uVar19 + (uVar1 & 0xffffffff);
  uVar35 = (uint)(uVar1 >> 0x20);
  uVar36 = uVar35 + uVar24;
  uVar1 = uVar17 * uVar7 + (uVar1 & 0xffffffff);
  uVar25 = (uint)(uVar1 >> 0x20);
  uVar29 = uVar25 + uVar36;
  lVar3 = uVar10 * uVar8 + (uVar1 & 0xffffffff);
  uVar32 = (uint)((ulong)lVar3 >> 0x20);
  uVar21 = (uint)CARRY4(uVar25,uVar36) +
           (uint)CARRY4(uVar23,uVar34) +
           (uint)CARRY4(uVar21,uVar31) + (uint)CARRY4(uVar30,uVar9) + (uint)CARRY4(uVar33,uVar13) +
           (uint)CARRY4(uVar35,uVar24) + (uint)CARRY4(uVar32,uVar29);
  uVar1 = uVar28 * uVar18 + (ulong)(uVar32 + uVar29);
  uVar25 = (uint)(uVar1 >> 0x20);
  uVar1 = uVar12 * uVar22 + (uVar1 & 0xffffffff);
  uVar13 = (uint)(uVar1 >> 0x20);
  uVar9 = uVar21 + uVar25;
  uVar23 = uVar13 + uVar9;
  uVar1 = uVar11 * uVar14 + (uVar1 & 0xffffffff);
  uVar31 = (uint)(uVar1 >> 0x20);
  uVar32 = uVar31 + uVar23;
  uVar1 = uVar20 * uVar16 + (uVar1 & 0xffffffff);
  uVar29 = (uint)(uVar1 >> 0x20);
  uVar30 = uVar29 + uVar32;
  uVar1 = uVar17 * uVar19 + (uVar1 & 0xffffffff);
  uVar33 = (uint)(uVar1 >> 0x20);
  uVar34 = uVar33 + uVar30;
  lVar4 = uVar7 * uVar8 + (uVar1 & 0xffffffff);
  uVar24 = (uint)((ulong)lVar4 >> 0x20);
  uVar9 = (uint)CARRY4(uVar33,uVar30) +
          (uint)CARRY4(uVar31,uVar23) + (uint)CARRY4(uVar13,uVar9) + (uint)CARRY4(uVar25,uVar21) +
          (uint)CARRY4(uVar29,uVar32) + (uint)CARRY4(uVar24,uVar34);
  uVar1 = uVar22 * uVar18 + (ulong)(uVar24 + uVar34);
  uVar21 = (uint)(uVar1 >> 0x20);
  uVar13 = uVar21 + uVar9;
  uVar1 = uVar12 * uVar14 + (uVar1 & 0xffffffff);
  uVar24 = (uint)(uVar1 >> 0x20);
  uVar25 = uVar24 + uVar13;
  uVar1 = uVar20 * uVar11 + (uVar1 & 0xffffffff);
  uVar31 = (uint)(uVar1 >> 0x20);
  uVar32 = uVar31 + uVar25;
  uVar1 = uVar17 * uVar16 + (uVar1 & 0xffffffff);
  uVar29 = (uint)(uVar1 >> 0x20);
  uVar30 = uVar29 + uVar32;
  lVar5 = uVar19 * uVar8 + (uVar1 & 0xffffffff);
  uVar23 = (uint)((ulong)lVar5 >> 0x20);
  uVar21 = (uint)CARRY4(uVar29,uVar32) +
           (uint)CARRY4(uVar24,uVar13) + (uint)CARRY4(uVar21,uVar9) + (uint)CARRY4(uVar31,uVar25) +
           (uint)CARRY4(uVar23,uVar30);
  uVar1 = uVar14 * uVar18 + (ulong)(uVar23 + uVar30);
  uVar24 = (uint)(uVar1 >> 0x20);
  uVar1 = uVar12 * uVar20 + (uVar1 & 0xffffffff);
  uVar25 = (uint)(uVar1 >> 0x20);
  uVar9 = uVar21 + uVar24;
  uVar29 = uVar25 + uVar9;
  local_5c = (undefined4)lVar2;
  local_58 = (undefined4)lVar3;
  local_54 = (undefined4)lVar4;
  uVar1 = uVar17 * uVar11 + (uVar1 & 0xffffffff);
  uVar13 = (uint)(uVar1 >> 0x20);
  uVar23 = uVar13 + uVar29;
  lVar2 = uVar16 * uVar8 + (uVar1 & 0xffffffff);
  local_4c = (undefined4)lVar2;
  uVar30 = (uint)((ulong)lVar2 >> 0x20);
  uVar9 = (uint)CARRY4(uVar13,uVar29) + (uint)CARRY4(uVar25,uVar9) + (uint)CARRY4(uVar24,uVar21) +
          (uint)CARRY4(uVar30,uVar23);
  uVar1 = uVar20 * uVar18 + (ulong)(uVar30 + uVar23);
  uVar21 = (uint)(uVar1 >> 0x20);
  local_50 = (undefined4)lVar5;
  uVar13 = uVar21 + uVar9;
  uVar1 = uVar17 * uVar12 + (uVar1 & 0xffffffff);
  uVar24 = (uint)(uVar1 >> 0x20);
  uVar25 = uVar24 + uVar13;
  lVar2 = uVar11 * uVar8 + (uVar1 & 0xffffffff);
  local_48 = (undefined4)lVar2;
  uVar23 = (uint)((ulong)lVar2 >> 0x20);
  uVar9 = (uint)CARRY4(uVar24,uVar13) + (uint)CARRY4(uVar21,uVar9) + (uint)CARRY4(uVar23,uVar25);
  uVar1 = uVar17 * uVar18 + (ulong)(uVar23 + uVar25);
  uVar21 = (uint)(uVar1 >> 0x20);
  lVar2 = uVar12 * uVar8 + (uVar1 & 0xffffffff);
  local_44 = (undefined4)lVar2;
  uVar24 = (uint)((ulong)lVar2 >> 0x20);
  uVar13 = uVar21 + uVar9;
  uVar23 = uVar13 + uVar24;
  uVar25 = (uint)(uVar8 * uVar18);
  local_40 = uVar25 + uVar23;
  local_3c = (uint)CARRY4(uVar13,uVar24) +
             (int)(uVar8 * uVar18 >> 0x20) + (uint)CARRY4(uVar21,uVar9) +
             (uint)CARRY4(uVar25,uVar23);
  secp256k1_scalar_reduce_512(r,&local_78);
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint32_t l[16];
    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);
}